

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

RegSlot __thiscall
ByteCodeGenerator::EnregisterBigIntConstant(ByteCodeGenerator *this,ParseNode *pnode)

{
  Type pFVar1;
  bool bVar2;
  Type *ppFVar3;
  ParseNode *local_38;
  ParseNode *pnode_local;
  RegSlot loc;
  
  pnode_local._4_4_ = 0xffffffff;
  local_38 = pnode;
  ppFVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar1 = *ppFVar3;
  bVar2 = JsUtil::
          BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<ParseNode*>
                    ((BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&pFVar1->bigintToRegister,&local_38,(uint *)((long)&pnode_local + 4));
  if (!bVar2) {
    ppFVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                        (&this->funcInfoStack->
                          super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    pnode_local._4_4_ = FuncInfo::NextConstRegister(*ppFVar3);
    JsUtil::
    BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<ParseNode*,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&pFVar1->bigintToRegister,&local_38,(uint *)((long)&pnode_local + 4));
  }
  return pnode_local._4_4_;
}

Assistant:

Js::RegSlot ByteCodeGenerator::EnregisterBigIntConstant(ParseNode* pnode)
{
    Js::RegSlot loc = Js::Constants::NoRegister;
    FuncInfo *top = funcInfoStack->Top();
    if (!top->bigintToRegister.TryGetValue(pnode, &loc))
    {
        loc = NextConstRegister();
        top->bigintToRegister.Add(pnode, loc);
    }
    return loc;
}